

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_quicblock(void)

{
  undefined8 *puVar1;
  uint8_t *__ptr;
  size_t sVar2;
  short *psVar3;
  int iVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  short *psVar8;
  short *psVar9;
  long lVar10;
  bool bVar11;
  uint8_t *_src;
  ptls_buffer_t local_68;
  short *local_40;
  uint64_t local_38;
  
  local_68.base = "";
  local_68.capacity = 0;
  local_68.off = 0;
  local_68.is_allocated = 0;
  iVar4 = ptls_buffer_reserve(&local_68,1);
  if (iVar4 == 0) {
    *(undefined1 *)((long)local_68.base + local_68.off) = 0;
    local_68.off = local_68.off + 1;
    iVar4 = 0;
  }
  sVar2 = local_68.off;
  if (iVar4 == 0) {
    iVar4 = ptls_buffer_reserve(&local_68,3);
    if (iVar4 == 0) {
      *(undefined1 *)((long)local_68.base + local_68.off + 2) = 99;
      *(undefined2 *)((long)local_68.base + local_68.off) = 0x6261;
      local_68.off = local_68.off + 3;
      iVar4 = 0;
    }
    if (iVar4 == 0) {
      iVar4 = ptls_buffer__adjust_quic_blocksize(&local_68,local_68.off - sVar2);
      bVar11 = iVar4 == 0;
      goto LAB_00124d24;
    }
  }
  bVar11 = false;
LAB_00124d24:
  psVar8 = (short *)local_68.base;
  if (bVar11) {
    psVar9 = (short *)(local_68.off + (long)local_68.base);
    local_40 = (short *)local_68.base;
    uVar5 = ptls_decode_quicint((uint8_t **)&local_40,(uint8_t *)psVar9);
    psVar3 = local_40;
    iVar6 = 6;
    if (uVar5 == 0xffffffffffffffff) {
      iVar7 = 0x32;
    }
    else if ((ulong)((long)psVar9 - (long)local_40) < uVar5) {
      iVar6 = 6;
      iVar7 = 0x32;
      psVar8 = local_40;
    }
    else {
      bVar11 = uVar5 == 3;
      iVar6 = 6;
      if (bVar11) {
        iVar6 = 0;
      }
      iVar7 = 0x32;
      if (bVar11) {
        iVar7 = iVar4;
      }
      _ok((uint)bVar11,"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
          0x5ea);
      _ok((uint)((char)psVar3[1] == 'c' && *psVar3 == 0x6261),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
          0x5eb);
      psVar8 = (short *)((long)psVar3 + 3);
    }
    iVar4 = iVar7;
    if ((iVar6 == 0) && (iVar4 = 0x32, psVar8 == psVar9)) {
      local_68.off = 0;
      iVar4 = ptls_buffer_reserve(&local_68,1);
      if (iVar4 == 0) {
        *(undefined1 *)((long)local_68.base + local_68.off) = 0;
        local_68.off = local_68.off + 1;
        iVar4 = 0;
      }
      sVar2 = local_68.off;
      if ((iVar4 == 0) && (iVar4 = ptls_buffer_reserve(&local_68,0x7b), iVar4 == 0)) {
        puVar1 = (undefined8 *)((long)local_68.base + local_68.off + 0x6b);
        *puVar1 = 0x5555555555555555;
        puVar1[1] = 0x5555555555555555;
        puVar1 = (undefined8 *)((long)local_68.base + local_68.off + 0x60);
        *puVar1 = 0x5555555555555555;
        puVar1[1] = 0x5555555555555555;
        puVar1 = (undefined8 *)((long)local_68.base + local_68.off + 0x50);
        *puVar1 = 0x5555555555555555;
        puVar1[1] = 0x5555555555555555;
        puVar1 = (undefined8 *)((long)local_68.base + local_68.off + 0x40);
        *puVar1 = 0x5555555555555555;
        puVar1[1] = 0x5555555555555555;
        puVar1 = (undefined8 *)((long)local_68.base + local_68.off + 0x30);
        *puVar1 = 0x5555555555555555;
        puVar1[1] = 0x5555555555555555;
        puVar1 = (undefined8 *)((long)local_68.base + local_68.off + 0x20);
        *puVar1 = 0x5555555555555555;
        puVar1[1] = 0x5555555555555555;
        puVar1 = (undefined8 *)((long)local_68.base + local_68.off + 0x10);
        *puVar1 = 0x5555555555555555;
        puVar1[1] = 0x5555555555555555;
        *(undefined8 *)((long)local_68.base + local_68.off) = 0x5555555555555555;
        ((undefined8 *)((long)local_68.base + local_68.off))[1] = 0x5555555555555555;
        local_68.off = local_68.off + 0x7b;
        iVar4 = ptls_buffer__adjust_quic_blocksize(&local_68,local_68.off - sVar2);
        bVar11 = iVar4 == 0;
      }
      else {
        bVar11 = false;
      }
      psVar8 = (short *)local_68.base;
      if (bVar11) {
        psVar9 = (short *)(local_68.off + (long)local_68.base);
        local_40 = (short *)local_68.base;
        uVar5 = ptls_decode_quicint((uint8_t **)&local_40,(uint8_t *)psVar9);
        psVar3 = local_40;
        iVar6 = 0x32;
        bVar11 = uVar5 == 0xffffffffffffffff;
        if (!bVar11) {
          if ((ulong)((long)psVar9 - (long)local_40) < uVar5) {
            iVar6 = 0x32;
            bVar11 = true;
            psVar8 = local_40;
          }
          else {
            local_38 = uVar5;
            _ok((uint)(uVar5 == 0x7b),"%s %d",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                ,0x5f9);
            lVar10 = 0;
            do {
              _ok((uint)(*(char *)((long)psVar3 + lVar10) == 'U'),"%s %d",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                  ,0x5fc);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x7b);
            bVar11 = local_38 != 0x7b;
            iVar6 = iVar4;
            if (bVar11) {
              iVar6 = 0x32;
            }
            psVar8 = (short *)((long)psVar3 + 0x7b);
          }
        }
        iVar4 = 0x32;
        if (psVar8 == psVar9) {
          iVar4 = iVar6;
        }
        if (bVar11) {
          iVar4 = iVar6;
        }
      }
    }
  }
  if (iVar4 != 0) {
    _ok(0,"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x601);
  }
  __ptr = local_68.base;
  (*ptls_clear_memory)(local_68.base,local_68.off);
  if (local_68.is_allocated != 0) {
    free(__ptr);
  }
  return;
}

Assistant:

static void test_quicblock(void)
{
    ptls_buffer_t buf;
    const uint8_t *src, *end;
    int ret;

    ptls_buffer_init(&buf, "", 0);

    ptls_buffer_push_block(&buf, -1, { ptls_buffer_pushv(&buf, "abc", 3); });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, -1, {
        ok(end - src == 3);
        ok(memcmp(src, "abc", 3) == 0);
        src += 3;
    });

    buf.off = 0;
    ptls_buffer_push_block(&buf, -1, {
        if ((ret = ptls_buffer_reserve(&buf, 123)) != 0)
            goto Exit;
        memset(buf.base + buf.off, 0x55, 123);
        buf.off += 123;
    });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, -1, {
        ok(end - src == 123);
        size_t i;
        for (i = 0; i != 123; ++i)
            ok(*src++ == 0x55);
    });

Exit:
    if (ret != 0)
        ok(!"fail");
    ptls_buffer_dispose(&buf);
}